

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.cpp
# Opt level: O3

error_code __thiscall
simdjson::haswell::implementation::minify
          (implementation *this,uint8_t *buf,size_t len,uint8_t *dst,size_t *dst_len)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  error_code eVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  size_t __n;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  uint8_t *guarded_dst;
  undefined1 (*pauVar26) [16];
  undefined1 (*__dest) [16];
  ulong uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint8_t out_block [128];
  uint8_t block [128];
  ulong local_170;
  undefined1 local_138 [16];
  undefined1 auStack_128 [16];
  undefined1 auStack_118 [16];
  undefined1 auStack_108 [80];
  undefined1 local_b8;
  undefined1 uStack_b7;
  undefined1 uStack_b6;
  undefined1 uStack_b5;
  undefined1 uStack_b4;
  undefined1 uStack_b3;
  undefined1 uStack_b2;
  undefined1 uStack_b1;
  undefined1 uStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  undefined1 uStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  undefined1 uStack_a8;
  undefined1 uStack_a7;
  undefined1 uStack_a6;
  undefined1 uStack_a5;
  undefined1 uStack_a4;
  undefined1 uStack_a3;
  undefined1 uStack_a2;
  undefined1 uStack_a1;
  undefined1 uStack_a0;
  undefined1 uStack_9f;
  undefined1 uStack_9e;
  undefined1 uStack_9d;
  undefined1 uStack_9c;
  undefined1 uStack_9b;
  undefined1 uStack_9a;
  undefined1 uStack_99;
  undefined1 local_98;
  undefined1 uStack_97;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined1 uStack_94;
  undefined1 uStack_93;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  undefined1 uStack_8f;
  undefined1 uStack_8e;
  undefined1 uStack_8d;
  undefined1 uStack_8c;
  undefined1 uStack_8b;
  undefined1 uStack_8a;
  undefined1 uStack_89;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined1 uStack_83;
  undefined1 uStack_82;
  undefined1 uStack_81;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 local_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  undefined1 uStack_72;
  undefined1 uStack_71;
  undefined1 uStack_70;
  undefined1 uStack_6f;
  undefined1 uStack_6e;
  undefined1 uStack_6d;
  undefined1 uStack_6c;
  undefined1 uStack_6b;
  undefined1 uStack_6a;
  undefined1 uStack_69;
  undefined1 uStack_68;
  undefined1 uStack_67;
  undefined1 uStack_66;
  undefined1 uStack_65;
  undefined1 uStack_64;
  undefined1 uStack_63;
  undefined1 uStack_62;
  undefined1 uStack_61;
  undefined1 uStack_60;
  undefined1 uStack_5f;
  undefined1 uStack_5e;
  undefined1 uStack_5d;
  undefined1 uStack_5c;
  undefined1 uStack_5b;
  undefined1 uStack_5a;
  undefined1 uStack_59;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined1 uStack_56;
  undefined1 uStack_55;
  undefined1 uStack_54;
  undefined1 uStack_53;
  undefined1 uStack_52;
  undefined1 uStack_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  undefined1 uStack_49;
  undefined1 uStack_48;
  undefined1 uStack_47;
  undefined1 uStack_46;
  undefined1 uStack_45;
  undefined1 uStack_44;
  undefined1 uStack_43;
  undefined1 uStack_42;
  undefined1 uStack_41;
  undefined1 uStack_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  
  auVar30 = _DAT_0018f160;
  uVar18 = 0;
  uVar27 = 0;
  local_170 = 0;
  uVar17 = len - 0x80;
  if (len < 0x80) {
    uVar17 = uVar18;
  }
  __dest = (undefined1 (*) [16])dst;
  if (len >= 0x80 && len - 0x80 != 0) {
    local_170 = 0;
    auVar28[8] = 0x5c;
    auVar28._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar28[9] = 0x5c;
    auVar28[10] = 0x5c;
    auVar28[0xb] = 0x5c;
    auVar28[0xc] = 0x5c;
    auVar28[0xd] = 0x5c;
    auVar28[0xe] = 0x5c;
    auVar28[0xf] = 0x5c;
    auVar28[0x10] = 0x5c;
    auVar28[0x11] = 0x5c;
    auVar28[0x12] = 0x5c;
    auVar28[0x13] = 0x5c;
    auVar28[0x14] = 0x5c;
    auVar28[0x15] = 0x5c;
    auVar28[0x16] = 0x5c;
    auVar28[0x17] = 0x5c;
    auVar28[0x18] = 0x5c;
    auVar28[0x19] = 0x5c;
    auVar28[0x1a] = 0x5c;
    auVar28[0x1b] = 0x5c;
    auVar28[0x1c] = 0x5c;
    auVar28[0x1d] = 0x5c;
    auVar28[0x1e] = 0x5c;
    auVar28[0x1f] = 0x5c;
    auVar29[8] = 0x22;
    auVar29._0_8_ = 0x2222222222222222;
    auVar29[9] = 0x22;
    auVar29[10] = 0x22;
    auVar29[0xb] = 0x22;
    auVar29[0xc] = 0x22;
    auVar29[0xd] = 0x22;
    auVar29[0xe] = 0x22;
    auVar29[0xf] = 0x22;
    auVar29[0x10] = 0x22;
    auVar29[0x11] = 0x22;
    auVar29[0x12] = 0x22;
    auVar29[0x13] = 0x22;
    auVar29[0x14] = 0x22;
    auVar29[0x15] = 0x22;
    auVar29[0x16] = 0x22;
    auVar29[0x17] = 0x22;
    auVar29[0x18] = 0x22;
    auVar29[0x19] = 0x22;
    auVar29[0x1a] = 0x22;
    auVar29[0x1b] = 0x22;
    auVar29[0x1c] = 0x22;
    auVar29[0x1d] = 0x22;
    auVar29[0x1e] = 0x22;
    auVar29[0x1f] = 0x22;
    auVar31 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar35._16_16_ = _DAT_0018a180;
    auVar35._0_16_ = _DAT_0018a180;
    uVar27 = 0;
    uVar18 = 0;
    pauVar26 = (undefined1 (*) [16])dst;
    do {
      auVar45 = *(undefined1 (*) [32])(buf + uVar18);
      auVar49 = *(undefined1 (*) [32])(buf + uVar18 + 0x20);
      auVar50 = vpcmpeqb_avx2(auVar45,auVar28);
      auVar1 = vpcmpeqb_avx2(auVar49,auVar28);
      uVar15 = CONCAT44((uint)(SUB321(auVar1 >> 7,0) & 1) | (uint)(SUB321(auVar1 >> 0xf,0) & 1) << 1
                        | (uint)(SUB321(auVar1 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar1 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar1 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar1 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar1 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar1 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar1 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar1 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar1 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar1 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar1 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar1 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar1 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar1 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar1 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar1 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar1 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar1 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar1 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar1 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar1 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar1 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar1 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar1 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar1 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar1 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar1 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar1 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar1 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar1[0x1f] >> 7) << 0x1f,
                        (uint)(SUB321(auVar50 >> 7,0) & 1) |
                        (uint)(SUB321(auVar50 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar50 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar50 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar50 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar50 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar50 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar50 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar50 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar50 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar50 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar50 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar50 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar50 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar50 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar50 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar50 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar50 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar50 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar50 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar50 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar50 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar50 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar50 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar50 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar50 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar50 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar50 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar50 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar50 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar50 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar50[0x1f] >> 7) << 0x1f);
      if (uVar15 == 0) {
        uVar20 = 0;
      }
      else {
        uVar15 = ~local_170 & uVar15;
        local_170 = uVar15 * 2 | local_170;
        uVar21 = ~local_170 & uVar15 & 0xaaaaaaaaaaaaaaaa;
        uVar20 = (ulong)CARRY8(uVar21,uVar15);
        local_170 = ((uVar21 + uVar15) * 2 ^ 0x5555555555555555) & local_170;
      }
      auVar50 = *(undefined1 (*) [32])(buf + uVar18 + 0x40);
      auVar1 = *(undefined1 (*) [32])(buf + uVar18 + 0x60);
      auVar57 = vpcmpeqb_avx2(auVar45,auVar29);
      auVar58 = vpcmpeqb_avx2(auVar49,auVar29);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = ~local_170 &
                     CONCAT44((uint)(SUB321(auVar58 >> 7,0) & 1) |
                              (uint)(SUB321(auVar58 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar58 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar58 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar58 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar58 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar58 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar58 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar58 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar58 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar58 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar58 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar58 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar58 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar58 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar58 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar58 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar58 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar58 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar58 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar58 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar58 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar58 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar58 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar58 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar58 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar58 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar58 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar58 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar58 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar58 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar58[0x1f] >> 7) << 0x1f,
                              (uint)(SUB321(auVar57 >> 7,0) & 1) |
                              (uint)(SUB321(auVar57 >> 0xf,0) & 1) << 1 |
                              (uint)(SUB321(auVar57 >> 0x17,0) & 1) << 2 |
                              (uint)(SUB321(auVar57 >> 0x1f,0) & 1) << 3 |
                              (uint)(SUB321(auVar57 >> 0x27,0) & 1) << 4 |
                              (uint)(SUB321(auVar57 >> 0x2f,0) & 1) << 5 |
                              (uint)(SUB321(auVar57 >> 0x37,0) & 1) << 6 |
                              (uint)(SUB321(auVar57 >> 0x3f,0) & 1) << 7 |
                              (uint)(SUB321(auVar57 >> 0x47,0) & 1) << 8 |
                              (uint)(SUB321(auVar57 >> 0x4f,0) & 1) << 9 |
                              (uint)(SUB321(auVar57 >> 0x57,0) & 1) << 10 |
                              (uint)(SUB321(auVar57 >> 0x5f,0) & 1) << 0xb |
                              (uint)(SUB321(auVar57 >> 0x67,0) & 1) << 0xc |
                              (uint)(SUB321(auVar57 >> 0x6f,0) & 1) << 0xd |
                              (uint)(SUB321(auVar57 >> 0x77,0) & 1) << 0xe |
                              (uint)SUB321(auVar57 >> 0x7f,0) << 0xf |
                              (uint)(SUB321(auVar57 >> 0x87,0) & 1) << 0x10 |
                              (uint)(SUB321(auVar57 >> 0x8f,0) & 1) << 0x11 |
                              (uint)(SUB321(auVar57 >> 0x97,0) & 1) << 0x12 |
                              (uint)(SUB321(auVar57 >> 0x9f,0) & 1) << 0x13 |
                              (uint)(SUB321(auVar57 >> 0xa7,0) & 1) << 0x14 |
                              (uint)(SUB321(auVar57 >> 0xaf,0) & 1) << 0x15 |
                              (uint)(SUB321(auVar57 >> 0xb7,0) & 1) << 0x16 |
                              (uint)SUB321(auVar57 >> 0xbf,0) << 0x17 |
                              (uint)(SUB321(auVar57 >> 199,0) & 1) << 0x18 |
                              (uint)(SUB321(auVar57 >> 0xcf,0) & 1) << 0x19 |
                              (uint)(SUB321(auVar57 >> 0xd7,0) & 1) << 0x1a |
                              (uint)(SUB321(auVar57 >> 0xdf,0) & 1) << 0x1b |
                              (uint)(SUB321(auVar57 >> 0xe7,0) & 1) << 0x1c |
                              (uint)(SUB321(auVar57 >> 0xef,0) & 1) << 0x1d |
                              (uint)(SUB321(auVar57 >> 0xf7,0) & 1) << 0x1e |
                              (uint)(byte)(auVar57[0x1f] >> 7) << 0x1f);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = auVar31._0_8_;
      auVar44 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar4 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar44 = auVar44 ^ auVar8 << uVar3;
        }
      }
      auVar57 = vpshufb_avx2(auVar35,auVar45);
      auVar58 = vpshufb_avx2(auVar35,auVar49);
      auVar57 = vpcmpeqb_avx2(auVar45,auVar57);
      auVar58 = vpcmpeqb_avx2(auVar58,auVar49);
      auVar76 = vpcmpeqb_avx2(auVar50,auVar28);
      auVar2 = vpcmpeqb_avx2(auVar1,auVar28);
      uVar15 = CONCAT44((uint)(SUB321(auVar2 >> 7,0) & 1) | (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1
                        | (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f,
                        (uint)(SUB321(auVar76 >> 7,0) & 1) |
                        (uint)(SUB321(auVar76 >> 0xf,0) & 1) << 1 |
                        (uint)(SUB321(auVar76 >> 0x17,0) & 1) << 2 |
                        (uint)(SUB321(auVar76 >> 0x1f,0) & 1) << 3 |
                        (uint)(SUB321(auVar76 >> 0x27,0) & 1) << 4 |
                        (uint)(SUB321(auVar76 >> 0x2f,0) & 1) << 5 |
                        (uint)(SUB321(auVar76 >> 0x37,0) & 1) << 6 |
                        (uint)(SUB321(auVar76 >> 0x3f,0) & 1) << 7 |
                        (uint)(SUB321(auVar76 >> 0x47,0) & 1) << 8 |
                        (uint)(SUB321(auVar76 >> 0x4f,0) & 1) << 9 |
                        (uint)(SUB321(auVar76 >> 0x57,0) & 1) << 10 |
                        (uint)(SUB321(auVar76 >> 0x5f,0) & 1) << 0xb |
                        (uint)(SUB321(auVar76 >> 0x67,0) & 1) << 0xc |
                        (uint)(SUB321(auVar76 >> 0x6f,0) & 1) << 0xd |
                        (uint)(SUB321(auVar76 >> 0x77,0) & 1) << 0xe |
                        (uint)SUB321(auVar76 >> 0x7f,0) << 0xf |
                        (uint)(SUB321(auVar76 >> 0x87,0) & 1) << 0x10 |
                        (uint)(SUB321(auVar76 >> 0x8f,0) & 1) << 0x11 |
                        (uint)(SUB321(auVar76 >> 0x97,0) & 1) << 0x12 |
                        (uint)(SUB321(auVar76 >> 0x9f,0) & 1) << 0x13 |
                        (uint)(SUB321(auVar76 >> 0xa7,0) & 1) << 0x14 |
                        (uint)(SUB321(auVar76 >> 0xaf,0) & 1) << 0x15 |
                        (uint)(SUB321(auVar76 >> 0xb7,0) & 1) << 0x16 |
                        (uint)SUB321(auVar76 >> 0xbf,0) << 0x17 |
                        (uint)(SUB321(auVar76 >> 199,0) & 1) << 0x18 |
                        (uint)(SUB321(auVar76 >> 0xcf,0) & 1) << 0x19 |
                        (uint)(SUB321(auVar76 >> 0xd7,0) & 1) << 0x1a |
                        (uint)(SUB321(auVar76 >> 0xdf,0) & 1) << 0x1b |
                        (uint)(SUB321(auVar76 >> 0xe7,0) & 1) << 0x1c |
                        (uint)(SUB321(auVar76 >> 0xef,0) & 1) << 0x1d |
                        (uint)(SUB321(auVar76 >> 0xf7,0) & 1) << 0x1e |
                        (uint)(byte)(auVar76[0x1f] >> 7) << 0x1f);
      if (uVar15 == 0) {
        local_170 = 0;
      }
      else {
        uVar21 = ~uVar20 & uVar15;
        uVar20 = uVar20 + uVar21 * 2;
        uVar15 = ~uVar20 & uVar15 & 0xaaaaaaaaaaaaaaaa;
        local_170 = (ulong)CARRY8(uVar15,uVar21);
        uVar20 = ((uVar15 + uVar21) * 2 ^ 0x5555555555555555) & uVar20;
      }
      uVar27 = auVar44._0_8_ ^ uVar27;
      auVar76 = vpcmpeqb_avx2(auVar50,auVar29);
      auVar2 = vpcmpeqb_avx2(auVar1,auVar29);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = ~uVar20 & CONCAT44((uint)(SUB321(auVar2 >> 7,0) & 1) |
                                        (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                        (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                        (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                        (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                        (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                        (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                        (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                        (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                        (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                        (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                        (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                        (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                        (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                        (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                        (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                        (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                        (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                        (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                        (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                        (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                        (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                        (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                        (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                        (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                        (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                        (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                        (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                        (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                        (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                        (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                        (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f,
                                        (uint)(SUB321(auVar76 >> 7,0) & 1) |
                                        (uint)(SUB321(auVar76 >> 0xf,0) & 1) << 1 |
                                        (uint)(SUB321(auVar76 >> 0x17,0) & 1) << 2 |
                                        (uint)(SUB321(auVar76 >> 0x1f,0) & 1) << 3 |
                                        (uint)(SUB321(auVar76 >> 0x27,0) & 1) << 4 |
                                        (uint)(SUB321(auVar76 >> 0x2f,0) & 1) << 5 |
                                        (uint)(SUB321(auVar76 >> 0x37,0) & 1) << 6 |
                                        (uint)(SUB321(auVar76 >> 0x3f,0) & 1) << 7 |
                                        (uint)(SUB321(auVar76 >> 0x47,0) & 1) << 8 |
                                        (uint)(SUB321(auVar76 >> 0x4f,0) & 1) << 9 |
                                        (uint)(SUB321(auVar76 >> 0x57,0) & 1) << 10 |
                                        (uint)(SUB321(auVar76 >> 0x5f,0) & 1) << 0xb |
                                        (uint)(SUB321(auVar76 >> 0x67,0) & 1) << 0xc |
                                        (uint)(SUB321(auVar76 >> 0x6f,0) & 1) << 0xd |
                                        (uint)(SUB321(auVar76 >> 0x77,0) & 1) << 0xe |
                                        (uint)SUB321(auVar76 >> 0x7f,0) << 0xf |
                                        (uint)(SUB321(auVar76 >> 0x87,0) & 1) << 0x10 |
                                        (uint)(SUB321(auVar76 >> 0x8f,0) & 1) << 0x11 |
                                        (uint)(SUB321(auVar76 >> 0x97,0) & 1) << 0x12 |
                                        (uint)(SUB321(auVar76 >> 0x9f,0) & 1) << 0x13 |
                                        (uint)(SUB321(auVar76 >> 0xa7,0) & 1) << 0x14 |
                                        (uint)(SUB321(auVar76 >> 0xaf,0) & 1) << 0x15 |
                                        (uint)(SUB321(auVar76 >> 0xb7,0) & 1) << 0x16 |
                                        (uint)SUB321(auVar76 >> 0xbf,0) << 0x17 |
                                        (uint)(SUB321(auVar76 >> 199,0) & 1) << 0x18 |
                                        (uint)(SUB321(auVar76 >> 0xcf,0) & 1) << 0x19 |
                                        (uint)(SUB321(auVar76 >> 0xd7,0) & 1) << 0x1a |
                                        (uint)(SUB321(auVar76 >> 0xdf,0) & 1) << 0x1b |
                                        (uint)(SUB321(auVar76 >> 0xe7,0) & 1) << 0x1c |
                                        (uint)(SUB321(auVar76 >> 0xef,0) & 1) << 0x1d |
                                        (uint)(SUB321(auVar76 >> 0xf7,0) & 1) << 0x1e |
                                        (uint)(byte)(auVar76[0x1f] >> 7) << 0x1f);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = auVar31._0_8_;
      auVar44 = (undefined1  [16])0x0;
      for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
        if ((auVar5 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
          auVar44 = auVar44 ^ auVar9 << uVar3;
        }
      }
      uVar21 = auVar44._0_8_ ^ (long)uVar27 >> 0x3f;
      auVar76 = vpshufb_avx2(auVar35,auVar50);
      auVar2 = vpshufb_avx2(auVar35,auVar1);
      auVar76 = vpcmpeqb_avx2(auVar76,auVar50);
      auVar2 = vpcmpeqb_avx2(auVar2,auVar1);
      uVar15 = ~uVar27 & CONCAT44((uint)(SUB321(auVar58 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar58 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar58 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar58 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar58 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar58 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar58 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar58 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar58 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar58 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar58 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar58 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar58 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar58 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar58 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar58 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar58 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar58 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar58 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar58 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar58 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar58 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar58 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar58 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar58 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar58 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar58 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar58 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar58 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar58 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar58 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar58[0x1f] >> 7) << 0x1f,
                                  (uint)(SUB321(auVar57 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar57 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar57 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar57 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar57 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar57 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar57 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar57 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar57 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar57 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar57 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar57 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar57 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar57 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar57 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar57 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar57 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar57 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar57 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar57 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar57 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar57 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar57 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar57 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar57 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar57 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar57 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar57 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar57 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar57 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar57 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar57[0x1f] >> 7) << 0x1f);
      uVar27 = (ulong)((uint)(uVar15 >> 0x10) & 0xff);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar15 >> 0x18 & 0xff) * 8);
      auVar69._8_8_ = 0;
      auVar69._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar44 = vpunpcklqdq_avx(auVar69,auVar59);
      auVar70._8_8_ = 0;
      auVar70._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar15 >> 8) & 0xff) * 8)
      ;
      auVar77._8_8_ = 0;
      auVar77._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar15 & 0xff) * 8);
      auVar4 = vpunpcklqdq_avx(auVar77,auVar70);
      auVar66._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar4;
      auVar66._16_16_ = ZEXT116(1) * auVar44;
      auVar57 = vpaddb_avx2(auVar66,auVar30);
      auVar45 = vpshufb_avx2(auVar45,auVar57);
      auVar67._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar15 & 0xff] * 8);
      auVar67._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar45 = vpshufb_avx2(auVar45,auVar67);
      *pauVar26 = auVar45._0_16_;
      uVar22 = POPCOUNT((uint)uVar15);
      *(undefined1 (*) [16])((long)pauVar26 + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar15 & 0xffff)))
           = auVar45._16_16_;
      uVar27 = uVar15 >> 0x30 & 0xff;
      uVar3 = (uint)(uVar15 >> 0x20);
      uVar20 = uVar15 >> 0x20 & 0xff;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar15 >> 0x38) * 8);
      auVar60._8_8_ = 0;
      auVar60._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar44 = vpunpcklqdq_avx(auVar60,auVar53);
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar20 * 8);
      auVar4 = vpunpcklqdq_avx(auVar78,auVar71);
      auVar57._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar4;
      auVar57._16_16_ = ZEXT116(1) * auVar44;
      auVar45 = vpaddb_avx2(auVar57,auVar30);
      auVar45 = vpshufb_avx2(auVar49,auVar45);
      auVar58._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar20] * 8);
      auVar58._16_16_ =
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar45 = vpshufb_avx2(auVar45,auVar58);
      *(undefined1 (*) [16])((long)pauVar26 + (0x20 - (ulong)uVar22)) = auVar45._0_16_;
      *(undefined1 (*) [16])
       ((long)pauVar26 + (-(ulong)(uint)POPCOUNT(uVar3 & 0xffff) - (ulong)uVar22) + 0x30) =
           auVar45._16_16_;
      lVar16 = POPCOUNT(~uVar15);
      uVar20 = ~uVar21 & CONCAT44((uint)(SUB321(auVar2 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar2 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar2 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar2 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar2 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar2 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar2 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar2 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar2 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar2 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar2 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar2 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar2 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar2 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar2 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar2 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar2 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar2 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar2 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar2 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar2 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar2 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar2 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar2 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar2 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar2 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar2 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar2 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar2 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar2 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar2 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar2[0x1f] >> 7) << 0x1f,
                                  (uint)(SUB321(auVar76 >> 7,0) & 1) |
                                  (uint)(SUB321(auVar76 >> 0xf,0) & 1) << 1 |
                                  (uint)(SUB321(auVar76 >> 0x17,0) & 1) << 2 |
                                  (uint)(SUB321(auVar76 >> 0x1f,0) & 1) << 3 |
                                  (uint)(SUB321(auVar76 >> 0x27,0) & 1) << 4 |
                                  (uint)(SUB321(auVar76 >> 0x2f,0) & 1) << 5 |
                                  (uint)(SUB321(auVar76 >> 0x37,0) & 1) << 6 |
                                  (uint)(SUB321(auVar76 >> 0x3f,0) & 1) << 7 |
                                  (uint)(SUB321(auVar76 >> 0x47,0) & 1) << 8 |
                                  (uint)(SUB321(auVar76 >> 0x4f,0) & 1) << 9 |
                                  (uint)(SUB321(auVar76 >> 0x57,0) & 1) << 10 |
                                  (uint)(SUB321(auVar76 >> 0x5f,0) & 1) << 0xb |
                                  (uint)(SUB321(auVar76 >> 0x67,0) & 1) << 0xc |
                                  (uint)(SUB321(auVar76 >> 0x6f,0) & 1) << 0xd |
                                  (uint)(SUB321(auVar76 >> 0x77,0) & 1) << 0xe |
                                  (uint)SUB321(auVar76 >> 0x7f,0) << 0xf |
                                  (uint)(SUB321(auVar76 >> 0x87,0) & 1) << 0x10 |
                                  (uint)(SUB321(auVar76 >> 0x8f,0) & 1) << 0x11 |
                                  (uint)(SUB321(auVar76 >> 0x97,0) & 1) << 0x12 |
                                  (uint)(SUB321(auVar76 >> 0x9f,0) & 1) << 0x13 |
                                  (uint)(SUB321(auVar76 >> 0xa7,0) & 1) << 0x14 |
                                  (uint)(SUB321(auVar76 >> 0xaf,0) & 1) << 0x15 |
                                  (uint)(SUB321(auVar76 >> 0xb7,0) & 1) << 0x16 |
                                  (uint)SUB321(auVar76 >> 0xbf,0) << 0x17 |
                                  (uint)(SUB321(auVar76 >> 199,0) & 1) << 0x18 |
                                  (uint)(SUB321(auVar76 >> 0xcf,0) & 1) << 0x19 |
                                  (uint)(SUB321(auVar76 >> 0xd7,0) & 1) << 0x1a |
                                  (uint)(SUB321(auVar76 >> 0xdf,0) & 1) << 0x1b |
                                  (uint)(SUB321(auVar76 >> 0xe7,0) & 1) << 0x1c |
                                  (uint)(SUB321(auVar76 >> 0xef,0) & 1) << 0x1d |
                                  (uint)(SUB321(auVar76 >> 0xf7,0) & 1) << 0x1e |
                                  (uint)(byte)(auVar76[0x1f] >> 7) << 0x1f);
      uVar27 = (ulong)((uint)(uVar20 >> 0x10) & 0xff);
      auVar47._8_8_ = 0;
      auVar47._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 >> 0x18 & 0xff) * 8);
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar44 = vpunpcklqdq_avx(auVar72,auVar47);
      auVar54._8_8_ = 0;
      auVar54._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar20 >> 8) & 0xff) * 8)
      ;
      auVar61._8_8_ = 0;
      auVar61._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 & 0xff) * 8);
      auVar4 = vpunpcklqdq_avx(auVar61,auVar54);
      auVar49._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar4;
      auVar49._16_16_ = ZEXT116(1) * auVar44;
      auVar45 = vpaddb_avx2(auVar49,auVar30);
      auVar45 = vpshufb_avx2(auVar50,auVar45);
      auVar50._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar20 & 0xff] * 8);
      auVar50._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar45 = vpshufb_avx2(auVar45,auVar50);
      *(undefined1 (*) [16])(*pauVar26 + lVar16) = auVar45._0_16_;
      *(undefined1 (*) [16])
       ((long)pauVar26 + (lVar16 - (ulong)(uint)POPCOUNT((uint)uVar20 & 0xffff)) + 0x10) =
           auVar45._16_16_;
      __dest = (undefined1 (*) [16])(*pauVar26 + POPCOUNT(~uVar20) + lVar16);
      lVar16 = lVar16 - (ulong)(uint)POPCOUNT((uint)uVar20);
      uVar27 = uVar20 >> 0x30 & 0xff;
      uVar3 = (uint)(uVar20 >> 0x20);
      uVar15 = uVar20 >> 0x20 & 0xff;
      auVar76._0_16_ =
           ZEXT116(0) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            ) + ZEXT116(1) *
                *(undefined1 (*) [16])
                 (internal::pshufb_combine_table +
                 (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8);
      auVar76._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
           ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8
            );
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar20 >> 0x38) * 8);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
      auVar44 = vpunpcklqdq_avx(auVar48,auVar44);
      auVar55._8_8_ = 0;
      auVar55._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
      auVar62._8_8_ = 0;
      auVar62._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar15 * 8);
      auVar4 = vpunpcklqdq_avx(auVar62,auVar55);
      auVar45._0_16_ = ZEXT116(0) * auVar44 + ZEXT116(1) * auVar4;
      auVar45._16_16_ = ZEXT116(1) * auVar44;
      auVar45 = vpaddb_avx2(auVar45,auVar30);
      auVar45 = vpshufb_avx2(auVar1,auVar45);
      auVar45 = vpshufb_avx2(auVar45,auVar76);
      *(undefined1 (*) [16])((long)pauVar26 + lVar16 + 0x20) = auVar45._0_16_;
      *(undefined1 (*) [16])
       ((long)pauVar26 + (lVar16 - (ulong)(uint)POPCOUNT(uVar3 & 0xffff)) + 0x30) = auVar45._16_16_;
      uVar27 = (long)uVar21 >> 0x3f;
      uVar18 = uVar18 + 0x80;
      pauVar26 = __dest;
    } while (uVar18 < uVar17);
  }
  __n = len - uVar18;
  if (__n != 0) {
    local_58 = 0x20;
    uStack_57 = 0x20;
    uStack_56 = 0x20;
    uStack_55 = 0x20;
    uStack_54 = 0x20;
    uStack_53 = 0x20;
    uStack_52 = 0x20;
    uStack_51 = 0x20;
    uStack_50 = 0x20;
    uStack_4f = 0x20;
    uStack_4e = 0x20;
    uStack_4d = 0x20;
    uStack_4c = 0x20;
    uStack_4b = 0x20;
    uStack_4a = 0x20;
    uStack_49 = 0x20;
    uStack_48 = 0x20;
    uStack_47 = 0x20;
    uStack_46 = 0x20;
    uStack_45 = 0x20;
    uStack_44 = 0x20;
    uStack_43 = 0x20;
    uStack_42 = 0x20;
    uStack_41 = 0x20;
    uStack_40 = 0x20;
    uStack_3f = 0x20;
    uStack_3e = 0x20;
    uStack_3d = 0x20;
    uStack_3c = 0x20;
    uStack_3b = 0x20;
    uStack_3a = 0x20;
    uStack_39 = 0x20;
    local_78 = 0x20;
    uStack_77 = 0x20;
    uStack_76 = 0x20;
    uStack_75 = 0x20;
    uStack_74 = 0x20;
    uStack_73 = 0x20;
    uStack_72 = 0x20;
    uStack_71 = 0x20;
    uStack_70 = 0x20;
    uStack_6f = 0x20;
    uStack_6e = 0x20;
    uStack_6d = 0x20;
    uStack_6c = 0x20;
    uStack_6b = 0x20;
    uStack_6a = 0x20;
    uStack_69 = 0x20;
    uStack_68 = 0x20;
    uStack_67 = 0x20;
    uStack_66 = 0x20;
    uStack_65 = 0x20;
    uStack_64 = 0x20;
    uStack_63 = 0x20;
    uStack_62 = 0x20;
    uStack_61 = 0x20;
    uStack_60 = 0x20;
    uStack_5f = 0x20;
    uStack_5e = 0x20;
    uStack_5d = 0x20;
    uStack_5c = 0x20;
    uStack_5b = 0x20;
    uStack_5a = 0x20;
    uStack_59 = 0x20;
    local_98 = 0x20;
    uStack_97 = 0x20;
    uStack_96 = 0x20;
    uStack_95 = 0x20;
    uStack_94 = 0x20;
    uStack_93 = 0x20;
    uStack_92 = 0x20;
    uStack_91 = 0x20;
    uStack_90 = 0x20;
    uStack_8f = 0x20;
    uStack_8e = 0x20;
    uStack_8d = 0x20;
    uStack_8c = 0x20;
    uStack_8b = 0x20;
    uStack_8a = 0x20;
    uStack_89 = 0x20;
    uStack_88 = 0x20;
    uStack_87 = 0x20;
    uStack_86 = 0x20;
    uStack_85 = 0x20;
    uStack_84 = 0x20;
    uStack_83 = 0x20;
    uStack_82 = 0x20;
    uStack_81 = 0x20;
    uStack_80 = 0x20;
    uStack_7f = 0x20;
    uStack_7e = 0x20;
    uStack_7d = 0x20;
    uStack_7c = 0x20;
    uStack_7b = 0x20;
    uStack_7a = 0x20;
    uStack_79 = 0x20;
    local_b8 = 0x20;
    uStack_b7 = 0x20;
    uStack_b6 = 0x20;
    uStack_b5 = 0x20;
    uStack_b4 = 0x20;
    uStack_b3 = 0x20;
    uStack_b2 = 0x20;
    uStack_b1 = 0x20;
    uStack_b0 = 0x20;
    uStack_af = 0x20;
    uStack_ae = 0x20;
    uStack_ad = 0x20;
    uStack_ac = 0x20;
    uStack_ab = 0x20;
    uStack_aa = 0x20;
    uStack_a9 = 0x20;
    uStack_a8 = 0x20;
    uStack_a7 = 0x20;
    uStack_a6 = 0x20;
    uStack_a5 = 0x20;
    uStack_a4 = 0x20;
    uStack_a3 = 0x20;
    uStack_a2 = 0x20;
    uStack_a1 = 0x20;
    uStack_a0 = 0x20;
    uStack_9f = 0x20;
    uStack_9e = 0x20;
    uStack_9d = 0x20;
    uStack_9c = 0x20;
    uStack_9b = 0x20;
    uStack_9a = 0x20;
    uStack_99 = 0x20;
    memcpy(&local_b8,buf + uVar18,__n);
    auVar1[1] = uStack_b7;
    auVar1[0] = local_b8;
    auVar1[2] = uStack_b6;
    auVar1[3] = uStack_b5;
    auVar1[4] = uStack_b4;
    auVar1[5] = uStack_b3;
    auVar1[6] = uStack_b2;
    auVar1[7] = uStack_b1;
    auVar1[8] = uStack_b0;
    auVar1[9] = uStack_af;
    auVar1[10] = uStack_ae;
    auVar1[0xb] = uStack_ad;
    auVar1[0xc] = uStack_ac;
    auVar1[0xd] = uStack_ab;
    auVar1[0xe] = uStack_aa;
    auVar1[0xf] = uStack_a9;
    auVar1[0x10] = uStack_a8;
    auVar1[0x11] = uStack_a7;
    auVar1[0x12] = uStack_a6;
    auVar1[0x13] = uStack_a5;
    auVar1[0x14] = uStack_a4;
    auVar1[0x15] = uStack_a3;
    auVar1[0x16] = uStack_a2;
    auVar1[0x17] = uStack_a1;
    auVar1[0x18] = uStack_a0;
    auVar1[0x19] = uStack_9f;
    auVar1[0x1a] = uStack_9e;
    auVar1[0x1b] = uStack_9d;
    auVar1[0x1c] = uStack_9c;
    auVar1[0x1d] = uStack_9b;
    auVar1[0x1e] = uStack_9a;
    auVar1[0x1f] = uStack_99;
    auVar2[1] = uStack_97;
    auVar2[0] = local_98;
    auVar2[2] = uStack_96;
    auVar2[3] = uStack_95;
    auVar2[4] = uStack_94;
    auVar2[5] = uStack_93;
    auVar2[6] = uStack_92;
    auVar2[7] = uStack_91;
    auVar2[8] = uStack_90;
    auVar2[9] = uStack_8f;
    auVar2[10] = uStack_8e;
    auVar2[0xb] = uStack_8d;
    auVar2[0xc] = uStack_8c;
    auVar2[0xd] = uStack_8b;
    auVar2[0xe] = uStack_8a;
    auVar2[0xf] = uStack_89;
    auVar2[0x10] = uStack_88;
    auVar2[0x11] = uStack_87;
    auVar2[0x12] = uStack_86;
    auVar2[0x13] = uStack_85;
    auVar2[0x14] = uStack_84;
    auVar2[0x15] = uStack_83;
    auVar2[0x16] = uStack_82;
    auVar2[0x17] = uStack_81;
    auVar2[0x18] = uStack_80;
    auVar2[0x19] = uStack_7f;
    auVar2[0x1a] = uStack_7e;
    auVar2[0x1b] = uStack_7d;
    auVar2[0x1c] = uStack_7c;
    auVar2[0x1d] = uStack_7b;
    auVar2[0x1e] = uStack_7a;
    auVar2[0x1f] = uStack_79;
    auVar13[1] = uStack_77;
    auVar13[0] = local_78;
    auVar13[2] = uStack_76;
    auVar13[3] = uStack_75;
    auVar13[4] = uStack_74;
    auVar13[5] = uStack_73;
    auVar13[6] = uStack_72;
    auVar13[7] = uStack_71;
    auVar13[8] = uStack_70;
    auVar13[9] = uStack_6f;
    auVar13[10] = uStack_6e;
    auVar13[0xb] = uStack_6d;
    auVar13[0xc] = uStack_6c;
    auVar13[0xd] = uStack_6b;
    auVar13[0xe] = uStack_6a;
    auVar13[0xf] = uStack_69;
    auVar13[0x10] = uStack_68;
    auVar13[0x11] = uStack_67;
    auVar13[0x12] = uStack_66;
    auVar13[0x13] = uStack_65;
    auVar13[0x14] = uStack_64;
    auVar13[0x15] = uStack_63;
    auVar13[0x16] = uStack_62;
    auVar13[0x17] = uStack_61;
    auVar13[0x18] = uStack_60;
    auVar13[0x19] = uStack_5f;
    auVar13[0x1a] = uStack_5e;
    auVar13[0x1b] = uStack_5d;
    auVar13[0x1c] = uStack_5c;
    auVar13[0x1d] = uStack_5b;
    auVar13[0x1e] = uStack_5a;
    auVar13[0x1f] = uStack_59;
    auVar14[1] = uStack_57;
    auVar14[0] = local_58;
    auVar14[2] = uStack_56;
    auVar14[3] = uStack_55;
    auVar14[4] = uStack_54;
    auVar14[5] = uStack_53;
    auVar14[6] = uStack_52;
    auVar14[7] = uStack_51;
    auVar14[8] = uStack_50;
    auVar14[9] = uStack_4f;
    auVar14[10] = uStack_4e;
    auVar14[0xb] = uStack_4d;
    auVar14[0xc] = uStack_4c;
    auVar14[0xd] = uStack_4b;
    auVar14[0xe] = uStack_4a;
    auVar14[0xf] = uStack_49;
    auVar14[0x10] = uStack_48;
    auVar14[0x11] = uStack_47;
    auVar14[0x12] = uStack_46;
    auVar14[0x13] = uStack_45;
    auVar14[0x14] = uStack_44;
    auVar14[0x15] = uStack_43;
    auVar14[0x16] = uStack_42;
    auVar14[0x17] = uStack_41;
    auVar14[0x18] = uStack_40;
    auVar14[0x19] = uStack_3f;
    auVar14[0x1a] = uStack_3e;
    auVar14[0x1b] = uStack_3d;
    auVar14[0x1c] = uStack_3c;
    auVar14[0x1d] = uStack_3b;
    auVar14[0x1e] = uStack_3a;
    auVar14[0x1f] = uStack_39;
    auVar39[8] = 0x5c;
    auVar39._0_8_ = 0x5c5c5c5c5c5c5c5c;
    auVar39[9] = 0x5c;
    auVar39[10] = 0x5c;
    auVar39[0xb] = 0x5c;
    auVar39[0xc] = 0x5c;
    auVar39[0xd] = 0x5c;
    auVar39[0xe] = 0x5c;
    auVar39[0xf] = 0x5c;
    auVar39[0x10] = 0x5c;
    auVar39[0x11] = 0x5c;
    auVar39[0x12] = 0x5c;
    auVar39[0x13] = 0x5c;
    auVar39[0x14] = 0x5c;
    auVar39[0x15] = 0x5c;
    auVar39[0x16] = 0x5c;
    auVar39[0x17] = 0x5c;
    auVar39[0x18] = 0x5c;
    auVar39[0x19] = 0x5c;
    auVar39[0x1a] = 0x5c;
    auVar39[0x1b] = 0x5c;
    auVar39[0x1c] = 0x5c;
    auVar39[0x1d] = 0x5c;
    auVar39[0x1e] = 0x5c;
    auVar39[0x1f] = 0x5c;
    auVar30 = vpcmpeqb_avx2(auVar1,auVar39);
    auVar28 = vpcmpeqb_avx2(auVar2,auVar39);
    uVar17 = CONCAT44((uint)(SUB321(auVar28 >> 7,0) & 1) | (uint)(SUB321(auVar28 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar28 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar28 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar28 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar28 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar28 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar28 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar28 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar28 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar28 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar28 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar28 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar28 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar28 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar28 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar28 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar28 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar28 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar28 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar28 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar28 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar28 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar28 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar28 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar28 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar28 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar28 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar28 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar28 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar28 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar28[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar30 >> 7,0) & 1) | (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    if (uVar17 == 0) {
      uVar17 = 0;
    }
    else {
      uVar18 = ~local_170 & uVar17;
      uVar15 = ~(uVar18 * 2) & uVar17 & 0xaaaaaaaaaaaaaaaa;
      uVar17 = (ulong)CARRY8(uVar15,uVar18);
      local_170 = ((uVar15 + uVar18) * 2 ^ 0x5555555555555555) & local_170 + uVar18 * 2;
    }
    auVar42[8] = 0x22;
    auVar42._0_8_ = 0x2222222222222222;
    auVar42[9] = 0x22;
    auVar42[10] = 0x22;
    auVar42[0xb] = 0x22;
    auVar42[0xc] = 0x22;
    auVar42[0xd] = 0x22;
    auVar42[0xe] = 0x22;
    auVar42[0xf] = 0x22;
    auVar42[0x10] = 0x22;
    auVar42[0x11] = 0x22;
    auVar42[0x12] = 0x22;
    auVar42[0x13] = 0x22;
    auVar42[0x14] = 0x22;
    auVar42[0x15] = 0x22;
    auVar42[0x16] = 0x22;
    auVar42[0x17] = 0x22;
    auVar42[0x18] = 0x22;
    auVar42[0x19] = 0x22;
    auVar42[0x1a] = 0x22;
    auVar42[0x1b] = 0x22;
    auVar42[0x1c] = 0x22;
    auVar42[0x1d] = 0x22;
    auVar42[0x1e] = 0x22;
    auVar42[0x1f] = 0x22;
    auVar30 = vpcmpeqb_avx2(auVar1,auVar42);
    auVar28 = vpcmpeqb_avx2(auVar2,auVar42);
    auVar31 = vpcmpeqd_avx(auVar28._0_16_,auVar28._0_16_);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = ~local_170 &
                   CONCAT44((uint)(SUB321(auVar28 >> 7,0) & 1) |
                            (uint)(SUB321(auVar28 >> 0xf,0) & 1) << 1 |
                            (uint)(SUB321(auVar28 >> 0x17,0) & 1) << 2 |
                            (uint)(SUB321(auVar28 >> 0x1f,0) & 1) << 3 |
                            (uint)(SUB321(auVar28 >> 0x27,0) & 1) << 4 |
                            (uint)(SUB321(auVar28 >> 0x2f,0) & 1) << 5 |
                            (uint)(SUB321(auVar28 >> 0x37,0) & 1) << 6 |
                            (uint)(SUB321(auVar28 >> 0x3f,0) & 1) << 7 |
                            (uint)(SUB321(auVar28 >> 0x47,0) & 1) << 8 |
                            (uint)(SUB321(auVar28 >> 0x4f,0) & 1) << 9 |
                            (uint)(SUB321(auVar28 >> 0x57,0) & 1) << 10 |
                            (uint)(SUB321(auVar28 >> 0x5f,0) & 1) << 0xb |
                            (uint)(SUB321(auVar28 >> 0x67,0) & 1) << 0xc |
                            (uint)(SUB321(auVar28 >> 0x6f,0) & 1) << 0xd |
                            (uint)(SUB321(auVar28 >> 0x77,0) & 1) << 0xe |
                            (uint)SUB321(auVar28 >> 0x7f,0) << 0xf |
                            (uint)(SUB321(auVar28 >> 0x87,0) & 1) << 0x10 |
                            (uint)(SUB321(auVar28 >> 0x8f,0) & 1) << 0x11 |
                            (uint)(SUB321(auVar28 >> 0x97,0) & 1) << 0x12 |
                            (uint)(SUB321(auVar28 >> 0x9f,0) & 1) << 0x13 |
                            (uint)(SUB321(auVar28 >> 0xa7,0) & 1) << 0x14 |
                            (uint)(SUB321(auVar28 >> 0xaf,0) & 1) << 0x15 |
                            (uint)(SUB321(auVar28 >> 0xb7,0) & 1) << 0x16 |
                            (uint)SUB321(auVar28 >> 0xbf,0) << 0x17 |
                            (uint)(SUB321(auVar28 >> 199,0) & 1) << 0x18 |
                            (uint)(SUB321(auVar28 >> 0xcf,0) & 1) << 0x19 |
                            (uint)(SUB321(auVar28 >> 0xd7,0) & 1) << 0x1a |
                            (uint)(SUB321(auVar28 >> 0xdf,0) & 1) << 0x1b |
                            (uint)(SUB321(auVar28 >> 0xe7,0) & 1) << 0x1c |
                            (uint)(SUB321(auVar28 >> 0xef,0) & 1) << 0x1d |
                            (uint)(SUB321(auVar28 >> 0xf7,0) & 1) << 0x1e |
                            (uint)(byte)(auVar28[0x1f] >> 7) << 0x1f,
                            (uint)(SUB321(auVar30 >> 7,0) & 1) |
                            (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                            (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                            (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                            (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                            (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                            (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                            (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                            (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                            (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                            (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                            (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                            (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                            (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                            (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                            (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                            (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                            (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                            (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                            (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                            (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                            (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                            (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                            (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                            (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                            (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                            (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                            (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                            (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                            (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                            (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                            (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = auVar31._0_8_;
    auVar44 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar6 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar44 = auVar44 ^ auVar10 << uVar3;
      }
    }
    uVar27 = auVar44._0_8_ ^ uVar27;
    auVar51._16_16_ = _DAT_0018a180;
    auVar51._0_16_ = _DAT_0018a180;
    auVar30 = vpshufb_avx2(auVar51,auVar1);
    auVar28 = vpshufb_avx2(auVar51,auVar2);
    auVar30 = vpcmpeqb_avx2(auVar30,auVar1);
    auVar28 = vpcmpeqb_avx2(auVar28,auVar2);
    auVar29 = vpcmpeqb_avx2(auVar13,auVar39);
    auVar35 = vpcmpeqb_avx2(auVar14,auVar39);
    uVar18 = CONCAT44((uint)(SUB321(auVar35 >> 7,0) & 1) | (uint)(SUB321(auVar35 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar35 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar35 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar35 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar35 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar35 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar35 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar35 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar35 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar35 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar35 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar35 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar35 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar35 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar35 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar35 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar35 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar35 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar35 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar35 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar35 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar35 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar35 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar35 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar35 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar35 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar35 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar35 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar35 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar35 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar35[0x1f] >> 7) << 0x1f,
                      (uint)(SUB321(auVar29 >> 7,0) & 1) | (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1
                      | (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                      (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                      (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                      (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                      (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                      (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                      (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                      (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                      (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                      (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                      (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                      (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                      (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                      (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                      (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                      (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                      (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                      (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                      (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                      (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                      (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                      (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                      (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                      (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                      (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                      (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                      (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                      (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                      (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                      (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    if (uVar18 != 0) {
      uVar15 = ~uVar17 & uVar18;
      uVar17 = (((~(uVar15 * 2) & uVar18 & 0x2aaaaaaaaaaaaaaa) + uVar15) * 2 ^ 0x5555555555555555) &
               uVar17 + uVar15 * 2;
    }
    auVar29 = vpcmpeqb_avx2(auVar13,auVar42);
    auVar35 = vpcmpeqb_avx2(auVar14,auVar42);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = ~uVar17 & CONCAT44((uint)(SUB321(auVar35 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar35 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar35 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar35 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar35 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar35 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar35 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar35 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar35 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar35 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar35 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar35 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar35 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar35 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar35 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar35 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar35 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar35 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar35 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar35 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar35 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar35 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar35 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar35 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar35 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar35 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar35 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar35 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar35 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar35 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar35 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar35[0x1f] >> 7) << 0x1f,
                                      (uint)(SUB321(auVar29 >> 7,0) & 1) |
                                      (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                                      (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                                      (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                                      (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                                      (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                                      (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                                      (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                                      (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                                      (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                                      (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                                      (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                                      (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                                      (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                                      (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                                      (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                                      (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                                      (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                                      (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                                      (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                                      (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                                      (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                                      (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                                      (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                                      (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                                      (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                                      (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                                      (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                                      (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                                      (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                                      (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                                      (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = auVar31._0_8_;
    auVar31 = (undefined1  [16])0x0;
    for (uVar3 = 0; uVar3 < 0x40; uVar3 = uVar3 + 1) {
      if ((auVar7 & (undefined1  [16])0x1 << uVar3) != (undefined1  [16])0x0) {
        auVar31 = auVar31 ^ auVar11 << uVar3;
      }
    }
    uVar20 = auVar31._0_8_ ^ (long)uVar27 >> 0x3f;
    auVar29 = vpshufb_avx2(auVar51,auVar13);
    auVar35 = vpshufb_avx2(auVar51,auVar14);
    auVar29 = vpcmpeqb_avx2(auVar13,auVar29);
    auVar35 = vpcmpeqb_avx2(auVar14,auVar35);
    uVar23 = ~uVar27 & CONCAT44((uint)(SUB321(auVar28 >> 7,0) & 1) |
                                (uint)(SUB321(auVar28 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar28 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar28 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar28 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar28 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar28 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar28 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar28 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar28 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar28 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar28 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar28 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar28 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar28 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar28 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar28 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar28 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar28 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar28 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar28 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar28 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar28 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar28 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar28 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar28 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar28 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar28 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar28 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar28 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar28 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar28[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar30 >> 7,0) & 1) |
                                (uint)(SUB321(auVar30 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar30 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar30 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar30 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar30 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar30 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar30 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar30 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar30 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar30 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar30 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar30 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar30 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar30 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar30 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar30 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar30 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar30 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar30 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar30 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar30 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar30 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar30 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar30 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar30 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar30 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar30 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar30 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar30 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar30 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar30[0x1f] >> 7) << 0x1f);
    uVar27 = (ulong)((uint)(uVar23 >> 0x10) & 0xff);
    auVar40._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar23 & 0xff] * 8);
    auVar40._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar27] * 8);
    uVar25 = uVar23 >> 0x30 & 0xff;
    uVar17 = uVar23 >> 0x20 & 0xff;
    auVar43._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar25] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar17] * 8
            );
    auVar43._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar25] * 8);
    uVar24 = ~uVar20 & CONCAT44((uint)(SUB321(auVar35 >> 7,0) & 1) |
                                (uint)(SUB321(auVar35 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar35 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar35 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar35 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar35 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar35 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar35 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar35 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar35 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar35 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar35 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar35 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar35 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar35 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar35 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar35 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar35 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar35 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar35 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar35 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar35 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar35 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar35 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar35 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar35 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar35 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar35 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar35 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar35 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar35 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar35[0x1f] >> 7) << 0x1f,
                                (uint)(SUB321(auVar29 >> 7,0) & 1) |
                                (uint)(SUB321(auVar29 >> 0xf,0) & 1) << 1 |
                                (uint)(SUB321(auVar29 >> 0x17,0) & 1) << 2 |
                                (uint)(SUB321(auVar29 >> 0x1f,0) & 1) << 3 |
                                (uint)(SUB321(auVar29 >> 0x27,0) & 1) << 4 |
                                (uint)(SUB321(auVar29 >> 0x2f,0) & 1) << 5 |
                                (uint)(SUB321(auVar29 >> 0x37,0) & 1) << 6 |
                                (uint)(SUB321(auVar29 >> 0x3f,0) & 1) << 7 |
                                (uint)(SUB321(auVar29 >> 0x47,0) & 1) << 8 |
                                (uint)(SUB321(auVar29 >> 0x4f,0) & 1) << 9 |
                                (uint)(SUB321(auVar29 >> 0x57,0) & 1) << 10 |
                                (uint)(SUB321(auVar29 >> 0x5f,0) & 1) << 0xb |
                                (uint)(SUB321(auVar29 >> 0x67,0) & 1) << 0xc |
                                (uint)(SUB321(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (uint)(SUB321(auVar29 >> 0x77,0) & 1) << 0xe |
                                (uint)SUB321(auVar29 >> 0x7f,0) << 0xf |
                                (uint)(SUB321(auVar29 >> 0x87,0) & 1) << 0x10 |
                                (uint)(SUB321(auVar29 >> 0x8f,0) & 1) << 0x11 |
                                (uint)(SUB321(auVar29 >> 0x97,0) & 1) << 0x12 |
                                (uint)(SUB321(auVar29 >> 0x9f,0) & 1) << 0x13 |
                                (uint)(SUB321(auVar29 >> 0xa7,0) & 1) << 0x14 |
                                (uint)(SUB321(auVar29 >> 0xaf,0) & 1) << 0x15 |
                                (uint)(SUB321(auVar29 >> 0xb7,0) & 1) << 0x16 |
                                (uint)SUB321(auVar29 >> 0xbf,0) << 0x17 |
                                (uint)(SUB321(auVar29 >> 199,0) & 1) << 0x18 |
                                (uint)(SUB321(auVar29 >> 0xcf,0) & 1) << 0x19 |
                                (uint)(SUB321(auVar29 >> 0xd7,0) & 1) << 0x1a |
                                (uint)(SUB321(auVar29 >> 0xdf,0) & 1) << 0x1b |
                                (uint)(SUB321(auVar29 >> 0xe7,0) & 1) << 0x1c |
                                (uint)(SUB321(auVar29 >> 0xef,0) & 1) << 0x1d |
                                (uint)(SUB321(auVar29 >> 0xf7,0) & 1) << 0x1e |
                                (uint)(byte)(auVar29[0x1f] >> 7) << 0x1f);
    uVar21 = (ulong)((uint)(uVar24 >> 0x10) & 0xff);
    auVar46._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar21] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table +
            (ulong)(byte)internal::BitsSetTable256mul2[uVar24 & 0xff] * 8);
    auVar46._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar21] * 8);
    uVar18 = uVar24 >> 0x30 & 0xff;
    uVar15 = uVar24 >> 0x20 & 0xff;
    auVar52._0_16_ =
         ZEXT116(0) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar18] * 8)
         + ZEXT116(1) *
           *(undefined1 (*) [16])
            (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar15] * 8
            );
    auVar52._16_16_ =
         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
         ZEXT116(1) *
         *(undefined1 (*) [16])
          (internal::pshufb_combine_table + (ulong)(byte)internal::BitsSetTable256mul2[uVar18] * 8);
    auVar56._8_8_ = 0;
    auVar56._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar23 >> 0x18 & 0xff) * 8);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar27 * 8);
    auVar31 = vpunpcklqdq_avx(auVar63,auVar56);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar23 >> 8) & 0xff) * 8);
    auVar79._8_8_ = 0;
    auVar79._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar23 & 0xff) * 8);
    auVar44 = vpunpcklqdq_avx(auVar79,auVar73);
    auVar68._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar44;
    auVar68._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar31;
    auVar30 = vpaddb_avx2(auVar68,_DAT_0018f160);
    auVar30 = vpshufb_avx2(auVar1,auVar30);
    auVar30 = vpshufb_avx2(auVar30,auVar40);
    local_138 = auVar30._0_16_;
    *(undefined1 (*) [16])(auStack_128 + -(ulong)(uint)POPCOUNT((uint)uVar23 & 0xffff)) =
         auVar30._16_16_;
    lVar16 = -(ulong)(uint)POPCOUNT((uint)uVar23);
    uVar3 = (uint)(uVar23 >> 0x20);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar23 >> 0x38) * 8);
    auVar37._8_8_ = 0;
    auVar37._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar25 * 8);
    auVar31 = vpunpcklqdq_avx(auVar37,auVar33);
    auVar64._8_8_ = 0;
    auVar64._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
    auVar74._8_8_ = 0;
    auVar74._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar17 * 8);
    auVar44 = vpunpcklqdq_avx(auVar74,auVar64);
    auVar36._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar44;
    auVar36._16_16_ = ZEXT116(1) * auVar31;
    auVar30 = vpaddb_avx2(_DAT_0018f160,auVar36);
    auVar30 = vpshufb_avx2(auVar2,auVar30);
    auVar30 = vpshufb_avx2(auVar30,auVar43);
    *(undefined1 (*) [16])(auStack_118 + lVar16) = auVar30._0_16_;
    *(undefined1 (*) [16])(auStack_108 + (lVar16 - (ulong)(uint)POPCOUNT(uVar3 & 0xffff))) =
         auVar30._16_16_;
    uVar3 = (uint)(uVar24 >> 0x20);
    uVar17 = *(ulong *)(internal::thintable_epi8 + (uVar24 >> 0x38) * 8);
    uVar18 = *(ulong *)(internal::thintable_epi8 + uVar18 * 8);
    uVar27 = *(ulong *)(internal::thintable_epi8 + (ulong)(uVar3 >> 8 & 0xff) * 8);
    pauVar26 = (undefined1 (*) [16])(local_138 + POPCOUNT(~uVar23));
    uVar15 = *(ulong *)(internal::thintable_epi8 + uVar15 * 8);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar24 >> 0x18 & 0xff) * 8);
    auVar34._8_8_ = 0;
    auVar34._0_8_ = *(ulong *)(internal::thintable_epi8 + uVar21 * 8);
    auVar31 = vpunpcklqdq_avx(auVar34,auVar31);
    auVar38._8_8_ = 0;
    auVar38._0_8_ = *(ulong *)(internal::thintable_epi8 + (ulong)((uint)(uVar24 >> 8) & 0xff) * 8);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = *(ulong *)(internal::thintable_epi8 + (uVar24 & 0xff) * 8);
    auVar44 = vpunpcklqdq_avx(auVar41,auVar38);
    auVar32._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar44;
    auVar32._16_16_ = ZEXT116(1) * auVar31;
    auVar30 = vpaddb_avx2(_DAT_0018f160,auVar32);
    auVar30 = vpshufb_avx2(auVar13,auVar30);
    auVar30 = vpshufb_avx2(auVar30,auVar46);
    *pauVar26 = auVar30._0_16_;
    *(undefined1 (*) [16])((long)pauVar26 + (0x10 - (ulong)(uint)POPCOUNT((uint)uVar24 & 0xffff))) =
         auVar30._16_16_;
    uVar22 = POPCOUNT((uint)uVar24);
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar17;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar18;
    auVar31 = vpunpcklqdq_avx(auVar75,auVar65);
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar27;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar15;
    auVar44 = vpunpcklqdq_avx(auVar81,auVar80);
    auVar30._0_16_ = ZEXT116(0) * auVar31 + ZEXT116(1) * auVar44;
    auVar30._16_16_ = ZEXT116(1) * auVar31;
    auVar30 = vpaddb_avx2(_DAT_0018f160,auVar30);
    auVar30 = vpshufb_avx2(auVar14,auVar30);
    auVar30 = vpshufb_avx2(auVar30,auVar52);
    *(undefined1 (*) [16])((long)pauVar26 + (0x20 - (ulong)uVar22)) = auVar30._0_16_;
    *(undefined1 (*) [16])
     ((long)pauVar26 + (-(ulong)(uint)POPCOUNT(uVar3 & 0xffff) - (ulong)uVar22) + 0x30) =
         auVar30._16_16_;
    uVar17 = POPCOUNT(~uVar24) + POPCOUNT(~uVar23);
    uVar27 = (long)uVar20 >> 0x3f;
    if (__n <= uVar17) {
      uVar17 = __n;
    }
    memcpy(__dest,local_138,uVar17);
    __dest = (undefined1 (*) [16])(*__dest + uVar17);
  }
  sVar19 = 0;
  eVar12 = UNCLOSED_STRING;
  if (uVar27 == 0) {
    sVar19 = (long)__dest - (long)dst;
    eVar12 = SUCCESS;
  }
  *dst_len = sVar19;
  return eVar12;
}

Assistant:

simdjson_warn_unused error_code implementation::minify(const uint8_t *buf, size_t len, uint8_t *dst, size_t &dst_len) const noexcept {
  return haswell::stage1::json_minifier::minify<128>(buf, len, dst, dst_len);
}